

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_table.cpp
# Opt level: O2

idx_t duckdb::LocateErrorIndex(bool is_append,ManagedSelection *matches)

{
  ulong uVar1;
  sel_t *psVar2;
  uint *puVar3;
  idx_t iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  undefined7 in_register_00000039;
  
  if ((int)CONCAT71(in_register_00000039,is_append) != 0) {
    uVar1 = matches->size;
    psVar2 = (matches->sel_vec).sel_vector;
    uVar5 = matches->count;
    if (uVar1 <= matches->count) {
      uVar5 = uVar1;
    }
    for (uVar7 = 0;
        (uVar6 = uVar5, uVar5 != uVar7 &&
        ((psVar2 == (sel_t *)0x0 || (uVar6 = uVar7, uVar7 == psVar2[uVar7])))); uVar7 = uVar7 + 1) {
    }
    iVar4 = 0xffffffffffffffff;
    if (uVar6 < uVar1) {
      iVar4 = uVar6;
    }
    return iVar4;
  }
  puVar3 = (matches->sel_vec).sel_vector;
  if (puVar3 == (uint *)0x0) {
    return 0;
  }
  return (ulong)*puVar3;
}

Assistant:

idx_t LocateErrorIndex(bool is_append, const ManagedSelection &matches) {
	// We expected to find nothing, so the first error is the first match.
	if (!is_append) {
		return matches[0];
	}
	// We expected to find matches for all of them, so the first missing match is the first error.
	return FirstMissingMatch(matches);
}